

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

bool_t ecIsOperable2(ec_o *ec)

{
  bool_t bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = objIsOperable2(ec);
  uVar2 = 0;
  uVar3 = 0;
  if ((((bVar1 != 0) && (0xaf < (ec->hdr).keep)) && ((ec->hdr).p_count == 6)) &&
     (uVar2 = uVar3, (ec->hdr).o_count == 1)) {
    bVar1 = memIsValid(ec->A,ec->f->n << 3);
    if (bVar1 != 0) {
      bVar1 = memIsValid(ec->B,ec->f->n << 3);
      if ((((bVar1 != 0) && (2 < ec->d)) &&
          ((ec->froma != (ec_froma_i)0x0 &&
           ((ec->toa != (ec_toa_i)0x0 && (ec->neg != (ec_neg_i)0x0)))))) &&
         ((ec->add != (ec_add_i)0x0 &&
          ((((ec->adda != (ec_adda_i)0x0 && (ec->sub != (ec_sub_i)0x0)) &&
            (ec->suba != (ec_suba_i)0x0)) && (ec->dbl != (ec_dbl_i)0x0)))))) {
        uVar2 = (uint)(ec->dbla != (ec_dbla_i)0x0);
      }
    }
  }
  return uVar2;
}

Assistant:

bool_t ecIsOperable2(const ec_o* ec)
{
	return objIsOperable2(ec) &&
		objKeep(ec) >= sizeof(ec_o) &&
		objPCount(ec) == 6 &&
		objOCount(ec) == 1 &&
		wwIsValid(ec->A, ec->f->n) &&
		wwIsValid(ec->B, ec->f->n) &&
		ec->d >= 3 &&
		ec->froma != 0 &&	
		ec->toa != 0 &&	
		ec->neg != 0 &&	
		ec->add != 0 &&	
		ec->adda != 0 &&	
		ec->sub != 0 &&	
		ec->suba != 0 &&	
		ec->dbl != 0 &&	
		ec->dbla != 0;
}